

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionaryTestCase.cpp
# Opt level: O0

void __thiscall
SuiteDataDictionaryTests::TestreadFromDocument_ComponentNodeInMessageNotFound::RunImpl
          (TestreadFromDocument_ComponentNodeInMessageNotFound *this)

{
  TestResults *this_00;
  long lVar1;
  PUGIXML_DOMDocument *this_01;
  pointer pDVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_5e8;
  ConfigError *anon_var_0;
  bool caught_;
  DOMDocumentPtr pDoc;
  istream is;
  allocator<char> local_491;
  string local_490 [8];
  string dictionaryXml;
  stringbuf local_460 [8];
  stringbuf buffer;
  DataDictionary local_3f8 [8];
  DataDictionary dictionary;
  TestreadFromDocument_ComponentNodeInMessageNotFound *this_local;
  
  FIX::DataDictionary::DataDictionary(local_3f8);
  std::__cxx11::stringbuf::stringbuf(local_460);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_490,
             "<fix type=\'FIX\' major=\'4\' minor=\'2\' servicepack=\'0\'><header><field name=\'BeginString\' required=\'Y\' /></header><fields><field number=\'8\' name=\'BeginString\' type=\'STRING\' ><value enum=\'1\' description=\'SINGLE_SECURITY\' /></field><field number=\'93\' name=\'SignatureLength\' type=\'STRING\' /><field number=\'627\' name=\'NoHops\' type=\'NUMINGROUP\' /><field number=\'628\' name=\'HopCompID\' type=\'STRING\' /><field number=\'55\' name=\'Symbol\' type=\'STRING\' /></fields><messages><message name=\'Advertisement\' msgtype=\'7\' msgcat=\'app\'><field name=\'BeginString\' required=\'Y\' /><component name=\'Unknown\' required=\'Y\' /></message></messages><trailer><field name=\'SignatureLength\' required=\'Y\' /><group name=\'NoHops\' required=\'N\'><field name=\'HopCompID\' required=\'N\' /></group></trailer><components><component name=\'Instrument\'><field name=\'Symbol\' required=\'N\' /></component></components></fix>"
             ,&local_491);
  std::allocator<char>::~allocator(&local_491);
  lVar1 = std::__cxx11::string::c_str();
  std::__cxx11::string::size();
  std::streambuf::sputn((char *)local_460,lVar1);
  std::istream::istream(&pDoc,(streambuf *)local_460);
  this_01 = (PUGIXML_DOMDocument *)operator_new(0xd8);
  FIX::PUGIXML_DOMDocument::PUGIXML_DOMDocument(this_01);
  std::unique_ptr<FIX::DOMDocument,std::default_delete<FIX::DOMDocument>>::
  unique_ptr<std::default_delete<FIX::DOMDocument>,void>
            ((unique_ptr<FIX::DOMDocument,std::default_delete<FIX::DOMDocument>> *)
             &stack0xfffffffffffffa48,(pointer)this_01);
  pDVar2 = std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::operator->
                     ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
                      &stack0xfffffffffffffa48);
  (**(code **)(*(long *)pDVar2 + 0x10))(pDVar2,&pDoc);
  anon_var_0._7_1_ = 0;
  FIX::DataDictionary::readFromDocument((unique_ptr *)local_3f8);
  if ((anon_var_0._7_1_ & 1) == 0) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    this_00 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_5e8,*ppTVar4,0x6f7);
    UnitTest::TestResults::OnTestFailure
              (this_00,&local_5e8,"Expected exception: \"ConfigError\" not thrown");
  }
  std::unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_>::~unique_ptr
            ((unique_ptr<FIX::DOMDocument,_std::default_delete<FIX::DOMDocument>_> *)
             &stack0xfffffffffffffa48);
  std::istream::~istream(&pDoc);
  std::__cxx11::string::~string(local_490);
  std::__cxx11::stringbuf::~stringbuf(local_460);
  FIX::DataDictionary::~DataDictionary(local_3f8);
  return;
}

Assistant:

TEST(readFromDocument_ComponentNodeInMessageNotFound) {
  DataDictionary dictionary;

  std::stringbuf buffer;
  std::string dictionaryXml =
      "<fix type='FIX' major='4' minor='2' servicepack='0'>"
        "<header>"
          "<field name='BeginString' required='Y' />"
        "</header>"
        "<fields>"
          "<field number='8' name='BeginString' type='STRING' >"
            "<value enum='1' description='SINGLE_SECURITY' />"
          "</field>"
          "<field number='93' name='SignatureLength' type='STRING' />"
          "<field number='627' name='NoHops' type='NUMINGROUP' />"
          "<field number='628' name='HopCompID' type='STRING' />"
          "<field number='55' name='Symbol' type='STRING' />"
        "</fields>"
        "<messages>"
          "<message name='Advertisement' msgtype='7' msgcat='app'>"
            "<field name='BeginString' required='Y' />"
            "<component name='Unknown' required='Y' />" //Component does not exist in components node
          "</message>"
        "</messages>"
        "<trailer>"
          "<field name='SignatureLength' required='Y' />"
          "<group name='NoHops' required='N'>"
             "<field name='HopCompID' required='N' />"
          "</group>"
        "</trailer>"
        "<components>"
          "<component name='Instrument'>"
            "<field name='Symbol' required='N' />"
          "</component>"
        "</components>"
      "</fix>";
  buffer.sputn(dictionaryXml.c_str(), dictionaryXml.size());
  std::istream is(&buffer);

  DOMDocumentPtr pDoc(new PUGIXML_DOMDocument());
  pDoc->load(is);

  CHECK_THROW(dictionary.readFromDocument(pDoc);, ConfigError);
}